

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_14f7919::QChildProcess::QChildProcess(QChildProcess *this,QProcessPrivate *d)

{
  CharPointerList *this_00;
  QByteArray *this_01;
  QArrayData *data;
  QString *pQVar1;
  undefined1 *puVar2;
  long lVar3;
  QProcessEnvironmentPrivate *pQVar4;
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  int iVar8;
  qsizetype qVar9;
  _Head_base<0UL,_char_**,_false> _Var10;
  _Base_ptr this_02;
  int *piVar11;
  undefined8 extraout_RAX;
  char *__file;
  size_t count;
  long lVar12;
  EVP_PKEY_CTX *ctx;
  int in_R8D;
  long lVar13;
  long lVar14;
  long in_FS_OFFSET;
  QByteArrayView needle;
  QByteArrayView data_00;
  QUtf8StringView fnName;
  QByteArrayView haystack;
  sigset_t emptyset;
  QByteArray local_e8;
  QString local_d0;
  sigset_t local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = d;
  qVar9 = QString::indexOf(&d->program,(QChar)0x2f,0,CaseSensitive);
  if (qVar9 == -1) {
    local_b8.__val[0] = 0;
    local_b8.__val[1] = 0;
    local_b8.__val[2] = 0;
    QStandardPaths::findExecutable(&local_d0,&d->program,(QStringList *)&local_b8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_b8);
  }
  else {
    local_d0.d.d = (d->program).d.d;
    local_d0.d.ptr = (d->program).d.ptr;
    local_d0.d.size = (d->program).d.size;
    if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_d0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_d0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  this_00 = &this->argv;
  this_02 = (_Base_ptr)&(this->argv).data;
  (this->argv).data.d.ptr = (char *)0x0;
  (this->argv).data.d.size = 0;
  (this_00->pointers)._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = (char **)0x0;
  (this->argv).data.d.d = (Data *)0x0;
  lVar12 = (d->arguments).d.size;
  _Var10._M_head_impl = (char **)operator_new__(lVar12 * 8 + 0x10);
  (this_00->pointers)._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = _Var10._M_head_impl;
  _Var10._M_head_impl[lVar12 + 1] = (char *)0x0;
  *_Var10._M_head_impl = (char *)0x0;
  QString::toLocal8Bit_helper((QByteArray *)&local_b8,(QChar *)local_d0.d.ptr,local_d0.d.size);
  data = &((this->argv).data.d.d)->super_QArrayData;
  pQVar1 = (QString *)(this->argv).data.d.ptr;
  (this->argv).data.d.d = (Data *)local_b8.__val[0];
  (this->argv).data.d.ptr = (char *)local_b8.__val[1];
  puVar2 = (undefined1 *)(this->argv).data.d.size;
  (this->argv).data.d.size = local_b8.__val[2];
  local_b8.__val[0] = (ulong)data;
  local_b8.__val[1] = (ulong)pQVar1;
  local_b8.__val[2] = (ulong)puVar2;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
  QByteArray::append((QByteArray *)this_02,'\0');
  lVar3 = (d->arguments).d.size;
  if (lVar3 != 0) {
    pQVar1 = (d->arguments).d.ptr;
    lVar13 = 8;
    lVar14 = 0;
    do {
      _Var10._M_head_impl =
           (this->argv).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>.
           _M_t.super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
           super__Head_base<0UL,_char_**,_false>._M_head_impl;
      if (_Var10._M_head_impl == (char **)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004323ec;
        _GLOBAL__N_1::QChildProcess();
        goto LAB_00432207;
      }
      *(qsizetype *)((long)_Var10._M_head_impl + lVar13) = (this->argv).data.d.size;
      QString::toLocal8Bit_helper
                ((QByteArray *)&local_b8,*(QChar **)((long)&(pQVar1->d).ptr + lVar14),
                 *(qsizetype *)((long)&(pQVar1->d).size + lVar14));
      QByteArray::append((QByteArray *)this_02,(QByteArray *)&local_b8);
      if ((QArrayData *)local_b8.__val[0] != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8.__val[0],1,0x10);
        }
      }
      QByteArray::append((QByteArray *)this_02,'\0');
      lVar13 = lVar13 + 8;
      lVar14 = lVar14 + 0x18;
    } while (lVar3 * 0x18 != lVar14);
  }
  CharPointerList::updatePointers(this_00,lVar12 + 1);
  if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar4 = (d->environment).d.d.ptr;
  (this->envp).data.d.ptr = (char *)0x0;
  (this->envp).data.d.size = 0;
  (this->envp).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = (char **)0x0;
  (this->envp).data.d.d = (Data *)0x0;
  if (pQVar4 != (QProcessEnvironmentPrivate *)0x0) {
    pQVar5 = (pQVar4->vars).d.d.ptr;
    if (pQVar5 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                   *)0x0) {
      count = 0;
    }
    else {
      count = *(size_t *)((long)&(pQVar5->m)._M_t._M_impl + 0x28);
    }
    this_01 = &(this->envp).data;
    _Var10._M_head_impl = (char **)operator_new__(-(ulong)(count + 1 >> 0x3d != 0) | count * 8 + 8);
    (this->envp).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
    super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
    super__Head_base<0UL,_char_**,_false>._M_head_impl = _Var10._M_head_impl;
    _Var10._M_head_impl[count] = (char *)0x0;
    pQVar5 = (pQVar4->vars).d.d.ptr;
    p_Var6 = (_Base_ptr)((long)&(pQVar5->m)._M_t._M_impl + 8);
    if (pQVar5 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                   *)0x0) {
      this_02 = (_Base_ptr)0x0;
      p_Var6 = (_Base_ptr)0x0;
    }
    else {
      this_02 = *(_Base_ptr *)((long)&(pQVar5->m)._M_t._M_impl + 0x18);
    }
    if (this_02 != p_Var6) {
      lVar12 = 0;
      do {
        _Var10._M_head_impl =
             (this->envp).pointers._M_t.
             super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
             super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
             super__Head_base<0UL,_char_**,_false>._M_head_impl;
        if (_Var10._M_head_impl == (char **)0x0) goto LAB_00432207;
        *(qsizetype *)((long)_Var10._M_head_impl + lVar12) = (this->envp).data.d.size;
        QByteArray::append(this_01,(QByteArray *)(this_02 + 1));
        QByteArray::append(this_01,'=');
        QProcEnvValue::bytes((QByteArray *)&local_b8,(QProcEnvValue *)&this_02[1]._M_right);
        QByteArray::append(this_01,(QByteArray *)&local_b8);
        if ((QArrayData *)local_b8.__val[0] != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_b8.__val[0],1,0x10);
          }
        }
        QByteArray::append(this_01,'\0');
        this_02 = (_Base_ptr)std::_Rb_tree_increment(this_02);
        lVar12 = lVar12 + 8;
      } while (this_02 != p_Var6);
    }
    CharPointerList::updatePointers(&this->envp,count);
  }
  this->workingDirectory = -2;
  this->isUsingVfork = false;
  this->oldstate = 1;
  lVar12 = (d->workingDirectory).d.size;
  if (lVar12 == 0) {
LAB_004320c6:
    if (this->isUsingVfork == true) {
      local_b8.__val[0xe] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xf] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xc] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xd] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[10] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xb] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[8] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[9] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[6] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[7] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[4] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[5] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[2] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[3] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[1] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      sigfillset(&local_b8);
      pthread_sigmask(2,&local_b8,(__sigset_t *)&this->oldsigset);
    }
    pthread_setcancelstate(1,&this->oldstate);
  }
  else {
    QString::toLocal8Bit_helper(&local_e8,(QChar *)(d->workingDirectory).d.ptr,lVar12);
    local_b8.__val[0] = 0x521500;
    bVar7 = operator!=(&local_e8,(char **)&local_b8);
    if ((bVar7) &&
       (needle.m_data = "/.", needle.m_size = 2, haystack.m_data = local_e8.d.ptr,
       haystack.m_size = local_e8.d.size, bVar7 = QtPrivate::endsWith(haystack,needle), !bVar7)) {
      data_00.m_data = "/.";
      data_00.m_size = 2;
      QByteArray::insert(&local_e8,local_e8.d.size,data_00);
    }
    __file = local_e8.d.ptr;
    if (local_e8.d.ptr == (char *)0x0) {
      __file = "";
    }
    do {
      iVar8 = open64(__file,0x290000,0x1ff);
      if (iVar8 != -1) break;
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    this->workingDirectory = iVar8;
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (-1 < this->workingDirectory) goto LAB_004320c6;
    fnName.m_size = 0xffffffff;
    fnName.m_data = (storage_type *)0x5;
    errorMessageForSyscall
              ((QString *)&local_b8,(anon_unknown_dwarf_14f7919 *)0x5af17a,fnName,in_R8D);
    ctx = (EVP_PKEY_CTX *)0x0;
    QProcessPrivate::setErrorAndEmit(d,FailedToStart,(QString *)&local_b8);
    if ((QArrayData *)local_b8.__val[0] != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8.__val[0])->_q_value).super___atomic_base<int>._M_i == 0) {
        ctx = (EVP_PKEY_CTX *)0x2;
        QArrayData::deallocate((QArrayData *)local_b8.__val[0],2,0x10);
      }
    }
    QProcessPrivate::cleanup(d,ctx);
    this->isUsingVfork = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004323ec:
  __stack_chk_fail();
LAB_00432207:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    _GLOBAL__N_1::QChildProcess();
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
      }
    }
    CharPointerList::~CharPointerList((CharPointerList *)this_02);
    CharPointerList::~CharPointerList(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(extraout_RAX);
    }
  }
  goto LAB_004323ec;
}

Assistant:

QChildProcess(QProcessPrivate *d)
        : d(d), argv(resolveExecutable(d->program), d->arguments),
          envp(d->environmentPrivate())
    {
        // Open the working directory first, because this operation can fail.
        // That way, if it does, we don't have anything to clean up.
        if (!d->workingDirectory.isEmpty()) {
            workingDirectory = opendirfd(QFile::encodeName(d->workingDirectory));
            if (workingDirectory < 0) {
                d->setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("chdir"));
                d->cleanup();

                // make sure our destructor does nothing
                isUsingVfork = false;
                return;
            }
        }

        // Block Unix signals, to ensure the user's handlers aren't run in the
        // child side and do something weird, especially if the handler and the
        // user of QProcess are completely different codebases.
        maybeBlockSignals();

        // Disable PThread cancellation until the child has successfully been
        // executed. We make a number of POSIX calls in the child that are thread
        // cancellation points and could cause an unexpected stack unwind. That
        // would be bad enough with regular fork(), but it's likely fatal with
        // vfork().
        disableThreadCancellations();
    }